

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_metric.c
# Opt level: O1

REF_STATUS
ref_metric_sub_tri_complexity
          (REF_INT n0,REF_INT n1,REF_INT n2,REF_INT *nodes,REF_DBL *metric,REF_DBL *complexity,
          REF_NODE ref_node)

{
  uint uVar1;
  undefined4 in_register_00000014;
  REF_INT *pRVar2;
  long lVar3;
  double dVar4;
  REF_DBL volume;
  REF_INT tri_nodes [3];
  double local_50;
  double local_48;
  REF_INT local_3c [3];
  
  pRVar2 = (REF_INT *)CONCAT44(in_register_00000014,n2);
  local_3c[0] = *pRVar2;
  local_3c[1] = pRVar2[(uint)n0];
  local_3c[2] = pRVar2[(uint)n1];
  uVar1 = ref_node_tri_area((REF_NODE)complexity,local_3c,&local_48);
  if (uVar1 == 0) {
    lVar3 = 0;
    do {
      if (*(int *)((long)complexity[10] + 4) ==
          *(int *)((long)complexity[5] + (long)local_3c[lVar3] * 4)) {
        uVar1 = ref_matrix_det_m((REF_DBL *)(nodes + (long)local_3c[lVar3] * 0xc),&local_50);
        if (uVar1 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
                 0x756,"ref_metric_sub_tri_complexity",(ulong)uVar1,"det");
          return uVar1;
        }
        if (0.0 < local_50) {
          if (local_50 < 0.0) {
            dVar4 = sqrt(local_50);
          }
          else {
            dVar4 = SQRT(local_50);
          }
          *metric = (dVar4 * local_48) / 3.0 + *metric;
        }
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 != 3);
    uVar1 = 0;
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",0x753,
           "ref_metric_sub_tri_complexity",(ulong)uVar1,"vol");
  }
  return uVar1;
}

Assistant:

REF_FCN static REF_STATUS ref_metric_sub_tri_complexity(
    REF_INT n0, REF_INT n1, REF_INT n2, REF_INT *nodes, REF_DBL *metric,
    REF_DBL *complexity, REF_NODE ref_node) {
  REF_DBL volume, det;
  REF_INT cell_node;
  REF_INT tri_nodes[3];
  tri_nodes[0] = nodes[n0];
  tri_nodes[1] = nodes[n1];
  tri_nodes[2] = nodes[n2];
  RSS(ref_node_tri_area(ref_node, tri_nodes, &volume), "vol");
  for (cell_node = 0; cell_node < 3; cell_node++) {
    if (ref_node_owned(ref_node, tri_nodes[cell_node])) {
      RSS(ref_matrix_det_m(&(metric[6 * tri_nodes[cell_node]]), &det), "det");
      if (det > 0.0) {
        (*complexity) += sqrt(det) * volume / 3.0;
      }
    }
  }

  return REF_SUCCESS;
}